

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O1

data_node_type * __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::split_upwards
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this,
          int key,int stop_propagation_level,
          vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
          *traversal_path,bool reuse_model,model_node_type **new_parent,bool verbose)

{
  int *piVar1;
  longlong *plVar2;
  uint8_t *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  short sVar7;
  model_node_type *pmVar8;
  _func_int **pp_Var9;
  double dVar10;
  undefined8 uVar11;
  double dVar12;
  pointer ppAVar13;
  bool bVar14;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *pAVar15;
  pointer ppAVar16;
  byte bVar17;
  byte bVar18;
  int iVar19;
  data_node_type *pdVar20;
  data_node_type *pdVar21;
  ostream *poVar22;
  ulong uVar23;
  data_node_type *pdVar24;
  data_node_type *pdVar25;
  self_type *psVar26;
  long *plVar27;
  undefined1 *puVar28;
  long lVar29;
  pointer pTVar30;
  int iVar31;
  uint uVar32;
  ulong uVar33;
  byte bVar34;
  byte bVar35;
  pointer pTVar36;
  data_node_type *pdVar37;
  ulong uVar38;
  uint uVar39;
  int iVar40;
  data_node_type *pdVar41;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *pAVar42;
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined8 uVar53;
  undefined1 auVar52 [64];
  double dVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  double dVar58;
  undefined8 in_XMM6_Qb;
  data_node_type *local_f8;
  data_node_type *local_e8;
  short *local_e0;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *local_c8;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *local_c0;
  ulong local_b8;
  vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
  *local_b0;
  vector<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_> to_delete;
  
  if (stop_propagation_level < this->root_node_->level_) {
    __assert_fail("stop_propagation_level >= root_node_->level_",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                  ,0x728,
                  "data_node_type *alex::Alex<int, int>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                 );
  }
  to_delete.
  super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  to_delete.
  super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  to_delete.
  super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar36 = (traversal_path->
            super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  pmVar8 = pTVar36[-1].node;
  iVar40 = pTVar36[-1].bucketID;
  pAVar42 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *
            )pmVar8->children_[iVar40];
  uVar39 = 1 << ((pAVar42->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
  local_b8 = (ulong)uVar39;
  iVar40 = iVar40 - iVar40 % (int)uVar39;
  dVar43 = (double)iVar40;
  dVar10 = (double)(int)uVar39 * 0.5 + dVar43;
  iVar31 = iVar40 + uVar39;
  piVar1 = &(this->stats_).num_sideways_splits;
  *piVar1 = *piVar1 + 1;
  plVar2 = &(this->stats_).num_sideways_split_keys;
  *plVar2 = *plVar2 + (long)pAVar42->num_keys_;
  dVar58 = (double)pAVar42->num_right_out_of_bounds_inserts_ / (double)pAVar42->num_inserts_;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar10;
  if (dVar58 <= 0.9) {
    bVar17 = 0;
LAB_0013bf40:
    bVar35 = 0;
  }
  else {
    auVar55._8_8_ = 0;
    auVar55._0_8_ = (pmVar8->super_AlexNode<int,_int>).model_.a_;
    auVar50._0_8_ = (double)pAVar42->max_key_;
    auVar50._8_8_ = in_XMM6_Qb;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (pmVar8->super_AlexNode<int,_int>).model_.b_;
    auVar4 = vfmadd213sd_fma(auVar50,auVar55,auVar4);
    if ((auVar4._0_8_ < dVar43) || (dVar10 <= auVar4._0_8_)) {
      auVar56._0_8_ = (double)iVar31;
      auVar56._8_8_ = in_XMM6_Qb;
      uVar53 = vcmppd_avx512vl(auVar57,auVar4,2);
      uVar11 = vcmppd_avx512vl(auVar4,auVar56,1);
      bVar17 = (byte)uVar53 & 3 & (byte)uVar11;
      goto LAB_0013bf40;
    }
    bVar17 = 0;
    bVar35 = 1;
  }
  auVar52 = ZEXT1664(CONCAT88(in_XMM6_Qb,(double)pAVar42->num_left_out_of_bounds_inserts_));
  dVar54 = (double)pAVar42->num_left_out_of_bounds_inserts_ / (double)pAVar42->num_inserts_;
  if (dVar54 <= 0.9) {
    bVar18 = 0;
  }
  else {
    auVar51._8_8_ = 0;
    auVar51._0_8_ = (pmVar8->super_AlexNode<int,_int>).model_.a_;
    auVar52 = ZEXT1664(auVar51);
    auVar47._0_8_ = (double)pAVar42->min_key_;
    auVar47._8_8_ = in_XMM6_Qb;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (pmVar8->super_AlexNode<int,_int>).model_.b_;
    auVar4 = vfmadd213sd_fma(auVar47,auVar51,auVar5);
    if ((dVar43 <= auVar4._0_8_) && (auVar4._0_8_ < dVar10)) {
      bVar18 = 0;
      bVar34 = 1;
      goto LAB_0013bfda;
    }
    auVar44._0_8_ = (double)iVar31;
    auVar44._8_8_ = in_XMM6_Qb;
    uVar53 = vcmppd_avx512vl(auVar57,auVar4,2);
    uVar11 = vcmppd_avx512vl(auVar4,auVar44,1);
    bVar18 = (byte)uVar53 & 3 & (byte)uVar11;
  }
  bVar34 = 0;
LAB_0013bfda:
  local_c8 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
              *)((dVar10 - (pmVar8->super_AlexNode<int,_int>).model_.b_) /
                (pmVar8->super_AlexNode<int,_int>).model_.a_);
  local_c0 = this;
  local_b0 = traversal_path;
  iVar19 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
           lower_bound<double>(pAVar42,(double *)&local_c8);
  pAVar15 = local_c0;
  pdVar20 = bulk_load_leaf_node_from_existing
                      (local_c0,pAVar42,0,iVar19,true,(FTNode *)0x0,reuse_model,
                       (bool)(0.9 < dVar58 & bVar35),(bool)(0.9 < dVar54 & bVar34));
  pdVar21 = bulk_load_leaf_node_from_existing
                      (pAVar15,pAVar42,iVar19,pAVar42->data_capacity_,true,(FTNode *)0x0,reuse_model
                       ,(bool)(0.9 < dVar58 & bVar17),(bool)(0.9 < dVar54 & bVar18));
  (pdVar20->super_AlexNode<int,_int>).duplication_factor_ =
       (pAVar42->super_AlexNode<int,_int>).duplication_factor_;
  (pdVar21->super_AlexNode<int,_int>).duplication_factor_ =
       (pAVar42->super_AlexNode<int,_int>).duplication_factor_;
  (pdVar20->super_AlexNode<int,_int>).level_ = (pAVar42->super_AlexNode<int,_int>).level_;
  (pdVar21->super_AlexNode<int,_int>).level_ = (pAVar42->super_AlexNode<int,_int>).level_;
  psVar26 = pAVar42->prev_leaf_;
  if (psVar26 != (self_type *)0x0) {
    psVar26->next_leaf_ = pdVar20;
  }
  pdVar20->prev_leaf_ = psVar26;
  pdVar20->next_leaf_ = pdVar21;
  pdVar21->prev_leaf_ = pdVar20;
  pdVar21->next_leaf_ = pAVar42->next_leaf_;
  if (pAVar42->next_leaf_ != (self_type *)0x0) {
    pAVar42->next_leaf_->prev_leaf_ = pdVar21;
  }
  local_c8 = pAVar42;
  if (to_delete.
      super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      to_delete.
      super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>>::
    _M_realloc_insert<alex::AlexNode<int,int>*>
              ((vector<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>> *)
               &to_delete,
               (iterator)
               to_delete.
               super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,(AlexNode<int,_int> **)&local_c8);
  }
  else {
    *to_delete.
     super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
     _M_impl.super__Vector_impl_data._M_finish = (AlexNode<int,_int> *)pAVar42;
    to_delete.
    super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         to_delete.
         super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  piVar1 = &(local_c0->stats_).num_data_nodes;
  *piVar1 = *piVar1 + -1;
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[Splitting upwards data node] level ",0x24);
    poVar22 = (ostream *)
              std::ostream::operator<<(&std::cout,(pAVar42->super_AlexNode<int,_int>).level_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar22,", node addr: ",0xd);
    poVar22 = std::ostream::_M_insert<void_const*>(poVar22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar22,", node repeats in parent: ",0x1a);
    poVar22 = (ostream *)std::ostream::operator<<(poVar22,(int)local_b8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar22,", node indexes in parent: [",0x1b);
    poVar22 = (ostream *)std::ostream::operator<<(poVar22,iVar40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar22,", ",2);
    poVar22 = (ostream *)std::ostream::operator<<(poVar22,iVar31);
    std::__ostream_insert<char,std::char_traits<char>>(poVar22,")",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar22,", left leaf indexes: [0, ",0x19);
    poVar22 = (ostream *)std::ostream::operator<<(poVar22,iVar19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar22,")",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar22,", right leaf indexes: [",0x17);
    poVar22 = (ostream *)std::ostream::operator<<(poVar22,iVar19);
    std::__ostream_insert<char,std::char_traits<char>>(poVar22,", ",2);
    poVar22 = (ostream *)std::ostream::operator<<(poVar22,pAVar42->data_capacity_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar22,")",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar22,", new nodes addr: ",0x12);
    poVar22 = std::ostream::_M_insert<void_const*>(poVar22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar22,",",1);
    poVar22 = std::ostream::_M_insert<void_const*>(poVar22);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar22 + -0x18) + (char)poVar22);
    std::ostream::put((char)poVar22);
    std::ostream::flush();
  }
  dVar43 = (pmVar8->super_AlexNode<int,_int>).model_.a_;
  dVar58 = (pmVar8->super_AlexNode<int,_int>).model_.b_;
  pTVar30 = (local_b0->
            super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar33 = (long)(local_b0->
                 super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar30;
  uVar38 = uVar33 >> 4;
  iVar31 = (int)uVar38;
  uVar33 = (long)(uVar33 * 0x10000000 + -0x100000000) >> 0x20;
  pTVar36 = pTVar30 + uVar33;
  pAVar42 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *
            )pTVar30[uVar33].node;
  iVar40 = (int)(pAVar42->super_AlexNode<int,_int>).level_;
  local_f8 = pdVar20;
  local_e8 = pdVar21;
  if (stop_propagation_level < iVar40) {
    puVar28 = &local_c0->field_0xbd;
    pdVar41 = pdVar20;
    do {
      uVar23 = uVar33;
      local_e0 = &(pAVar42->super_AlexNode<int,_int>).level_;
      piVar1 = &(local_c0->stats_).num_model_node_splits;
      *piVar1 = *piVar1 + 1;
      iVar40 = *(int *)&pAVar42->allocator_;
      plVar2 = &(local_c0->stats_).num_model_node_split_pointers;
      *plVar2 = *plVar2 + (long)iVar40;
      iVar31 = pTVar36->bucketID;
      iVar40 = iVar40 / 2;
      if (iVar31 < iVar40) {
        lVar29 = (long)iVar40;
        if (1 << (*(byte *)((long)(&(pAVar42->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)
                                  [lVar29] + 9) & 0x1f) == iVar40) {
          pdVar24 = (data_node_type *)operator_new(0x40);
          local_b8 = CONCAT71((int7)((ulong)lVar29 >> 8),1);
          bVar14 = false;
          pdVar37 = (data_node_type *)0x0;
          pdVar25 = pdVar24;
        }
        else {
LAB_0013c463:
          pdVar25 = (data_node_type *)operator_new(0x40);
          sVar7 = *local_e0;
          (pdVar25->super_AlexNode<int,_int>).is_leaf_ = false;
          (pdVar25->super_AlexNode<int,_int>).duplication_factor_ = '\0';
          (pdVar25->super_AlexNode<int,_int>).level_ = sVar7;
          (pdVar25->super_AlexNode<int,_int>).model_.a_ = 0.0;
          (pdVar25->super_AlexNode<int,_int>).model_.b_ = 0.0;
          (pdVar25->super_AlexNode<int,_int>).cost_ = 0.0;
          (pdVar25->super_AlexNode<int,_int>)._vptr_AlexNode =
               (_func_int **)&PTR__AlexModelNode_00164b98;
          pdVar25->key_less_ = (AlexCompare *)puVar28;
          *(undefined4 *)&pdVar25->allocator_ = 0;
          local_b8 = 0;
          pdVar25->next_leaf_ = (self_type *)0x0;
          pdVar24 = (data_node_type *)operator_new(0x40);
          bVar14 = false;
          pdVar37 = pdVar24;
        }
      }
      else {
        if (1 << (*(byte *)((long)(pAVar42->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode + 9
                           ) & 0x1f) != iVar40) goto LAB_0013c463;
        pdVar24 = (data_node_type *)operator_new(0x40);
        bVar14 = true;
        local_b8 = 0;
        pdVar25 = (data_node_type *)0x0;
        pdVar37 = pdVar24;
      }
      sVar7 = *local_e0;
      (pdVar24->super_AlexNode<int,_int>).is_leaf_ = false;
      (pdVar24->super_AlexNode<int,_int>).duplication_factor_ = '\0';
      (pdVar24->super_AlexNode<int,_int>).level_ = sVar7;
      (pdVar24->super_AlexNode<int,_int>).model_.a_ = 0.0;
      (pdVar24->super_AlexNode<int,_int>).model_.b_ = 0.0;
      (pdVar24->super_AlexNode<int,_int>).cost_ = 0.0;
      (pdVar24->super_AlexNode<int,_int>)._vptr_AlexNode =
           (_func_int **)&PTR__AlexModelNode_00164b98;
      pdVar24->key_less_ = (AlexCompare *)puVar28;
      *(undefined4 *)&pdVar24->allocator_ = 0;
      pdVar24->next_leaf_ = (self_type *)0x0;
      local_f8._0_4_ = (int)uVar38;
      local_f8 = pdVar25;
      if (iVar31 < iVar40) {
        if (pdVar25 == (data_node_type *)0x0) {
          __assert_fail("left_split != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                        ,0x7b2,
                        "data_node_type *alex::Alex<int, int>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                       );
        }
        if ((int)local_f8 ==
            (int)((ulong)((long)(local_b0->
                                super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_b0->
                               super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 4)) {
          *new_parent = (model_node_type *)pdVar25;
        }
        iVar40 = *(int *)&pAVar42->allocator_;
        *(int *)&pdVar25->allocator_ = iVar40;
        psVar26 = (self_type *)
                  __gnu_cxx::new_allocator<alex::AlexNode<int,_int>_*>::allocate
                            ((new_allocator<alex::AlexNode<int,_int>_*> *)&local_c8,(long)iVar40,
                             (void *)0x0);
        pdVar25->next_leaf_ = psVar26;
        dVar54 = (pAVar42->super_AlexNode<int,_int>).model_.a_;
        dVar12 = (pAVar42->super_AlexNode<int,_int>).model_.b_;
        (pdVar25->super_AlexNode<int,_int>).model_.a_ = dVar54 + dVar54;
        (pdVar25->super_AlexNode<int,_int>).model_.b_ = dVar12 + dVar12;
        iVar40 = *(int *)&pAVar42->allocator_ / 2;
        iVar31 = 0;
        if (1 < *(int *)&pAVar42->allocator_) {
          iVar31 = 0;
          do {
            pp_Var9 = (&(pAVar42->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[iVar31];
            bVar17 = *(byte *)((long)pp_Var9 + 9);
            if (bVar17 != 0x1f) {
              lVar29 = (long)(iVar31 * 2);
              do {
                (&(pdVar25->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[lVar29] = pp_Var9;
                lVar29 = lVar29 + 1;
              } while ((2 << (bVar17 & 0x1f)) + iVar31 * 2 != lVar29);
            }
            iVar31 = iVar31 + (1 << (bVar17 & 0x1f));
            *(byte *)((long)pp_Var9 + 9) = bVar17 + 1;
          } while (iVar31 < iVar40);
        }
        if (iVar31 != iVar40) {
          __assert_fail("cur == cur_node->num_children_ / 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                        ,0x7c6,
                        "data_node_type *alex::Alex<int, int>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                       );
        }
        if ((char)local_b8 == '\0') {
          *(int *)&pdVar37->allocator_ = iVar40;
          psVar26 = (self_type *)
                    __gnu_cxx::new_allocator<alex::AlexNode<int,_int>_*>::allocate
                              ((new_allocator<alex::AlexNode<int,_int>_*> *)&local_c8,(long)iVar40,
                               (void *)0x0);
          pdVar37->next_leaf_ = psVar26;
          (pdVar37->super_AlexNode<int,_int>).model_.a_ =
               (pAVar42->super_AlexNode<int,_int>).model_.a_;
          iVar40 = *(int *)&pAVar42->allocator_;
          (pdVar37->super_AlexNode<int,_int>).model_.b_ =
               (pAVar42->super_AlexNode<int,_int>).model_.b_ - (double)(iVar40 / 2);
          if (0 < (long)iVar40) {
            uVar33 = (ulong)(uint)(iVar40 / 2);
            lVar29 = 0;
            do {
              *(_func_int ***)
               ((long)&(pdVar37->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode + lVar29) =
                   (&(pAVar42->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[uVar33];
              uVar33 = uVar33 + 1;
              lVar29 = lVar29 + 8;
            } while (uVar33 < (ulong)(long)iVar40);
          }
        }
        else {
          pdVar37 = (data_node_type *)
                    (&(pAVar42->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[iVar40];
          (pdVar37->super_AlexNode<int,_int>).level_ = *local_e0;
        }
        iVar31 = pTVar36->bucketID * 2;
        iVar19 = 2 << ((pdVar41->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
        iVar31 = iVar31 - iVar31 % iVar19;
        iVar40 = (iVar19 >> 1) + iVar31;
        if (0 < iVar19 >> 1) {
          lVar29 = (long)iVar31;
          do {
            (&(pdVar25->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[lVar29] =
                 (_func_int **)pdVar41;
            lVar29 = lVar29 + 1;
          } while (lVar29 < iVar40);
        }
        if (0 < iVar19) {
          lVar29 = (long)iVar40;
          do {
            (&(pdVar25->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[lVar29] =
                 (_func_int **)local_e8;
            lVar29 = lVar29 + 1;
          } while (lVar29 < iVar31 + iVar19);
        }
      }
      else {
        if (pdVar37 == (data_node_type *)0x0) {
          __assert_fail("right_split != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                        ,0x7ed,
                        "data_node_type *alex::Alex<int, int>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                       );
        }
        if ((int)local_f8 ==
            (int)((ulong)((long)(local_b0->
                                super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_b0->
                               super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 4)) {
          *new_parent = (model_node_type *)pdVar37;
        }
        if (bVar14) {
          local_f8 = (data_node_type *)
                     (pAVar42->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode;
          (local_f8->super_AlexNode<int,_int>).level_ = *local_e0;
        }
        else {
          iVar40 = *(int *)&pAVar42->allocator_ / 2;
          *(int *)&pdVar25->allocator_ = iVar40;
          psVar26 = (self_type *)
                    __gnu_cxx::new_allocator<alex::AlexNode<int,_int>_*>::allocate
                              ((new_allocator<alex::AlexNode<int,_int>_*> *)&local_c8,(long)iVar40,
                               (void *)0x0);
          pdVar25->next_leaf_ = psVar26;
          dVar54 = (pAVar42->super_AlexNode<int,_int>).model_.b_;
          (pdVar25->super_AlexNode<int,_int>).model_.a_ =
               (pAVar42->super_AlexNode<int,_int>).model_.a_;
          (pdVar25->super_AlexNode<int,_int>).model_.b_ = dVar54;
          uVar39 = *(uint *)&pAVar42->allocator_;
          if (1 < (int)uVar39) {
            uVar33 = 0;
            do {
              (&(pdVar25->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[uVar33] =
                   (&(pAVar42->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[uVar33];
              uVar33 = uVar33 + 1;
            } while (uVar39 >> 1 != uVar33);
          }
        }
        iVar40 = *(int *)&pAVar42->allocator_;
        *(int *)&pdVar37->allocator_ = iVar40;
        psVar26 = (self_type *)
                  __gnu_cxx::new_allocator<alex::AlexNode<int,_int>_*>::allocate
                            ((new_allocator<alex::AlexNode<int,_int>_*> *)&local_c8,(long)iVar40,
                             (void *)0x0);
        pdVar37->next_leaf_ = psVar26;
        uVar39 = *(uint *)&pAVar42->allocator_;
        uVar32 = (int)uVar39 / 2;
        auVar48._8_8_ = 0;
        auVar48._0_8_ = (pAVar42->super_AlexNode<int,_int>).model_.a_;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = (pAVar42->super_AlexNode<int,_int>).model_.b_ - (double)(int)uVar32;
        auVar57 = vunpcklpd_avx(auVar48,auVar45);
        (pdVar37->super_AlexNode<int,_int>).model_.a_ = auVar57._0_8_ + auVar57._0_8_;
        (pdVar37->super_AlexNode<int,_int>).model_.b_ = auVar57._8_8_ + auVar57._8_8_;
        if (0 < (int)uVar39) {
          do {
            pp_Var9 = (&(pAVar42->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[(int)uVar32]
            ;
            bVar17 = *(byte *)((long)pp_Var9 + 9);
            if (bVar17 != 0x1f) {
              lVar29 = (long)(int)((uVar32 - (uVar39 >> 1)) * 2);
              do {
                (&(pdVar37->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[lVar29] = pp_Var9;
                lVar29 = lVar29 + 1;
              } while ((int)((2 << (bVar17 & 0x1f)) + (uVar32 * 2 - (uVar39 & 0x7ffffffe))) !=
                       lVar29);
            }
            *(byte *)((long)pp_Var9 + 9) = bVar17 + 1;
            uVar32 = uVar32 + (1 << (bVar17 & 0x1f));
          } while ((int)uVar32 < (int)uVar39);
        }
        if (uVar32 != uVar39) {
          __assert_fail("cur == cur_node->num_children_",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                        ,0x816,
                        "data_node_type *alex::Alex<int, int>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                       );
        }
        iVar31 = (pTVar36->bucketID - (uVar39 - ((int)uVar39 >> 0x1f) >> 1)) * 2;
        iVar19 = 2 << ((pdVar41->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
        iVar31 = iVar31 - iVar31 % iVar19;
        iVar40 = (iVar19 >> 1) + iVar31;
        if (0 < iVar19 >> 1) {
          lVar29 = (long)iVar31;
          do {
            (&(pdVar37->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[lVar29] =
                 (_func_int **)pdVar41;
            lVar29 = lVar29 + 1;
          } while (lVar29 < iVar40);
        }
        if (0 < iVar19) {
          lVar29 = (long)iVar40;
          do {
            (&(pdVar37->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[lVar29] =
                 (_func_int **)local_e8;
            lVar29 = lVar29 + 1;
          } while (lVar29 < iVar31 + iVar19);
        }
      }
      if ((pdVar37 == (data_node_type *)0x0) || (local_f8 == (data_node_type *)0x0)) {
        __assert_fail("next_left_split != nullptr && next_right_split != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                      ,0x829,
                      "data_node_type *alex::Alex<int, int>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                     );
      }
      if (verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"[Splitting upwards through-node] level ",0x27);
        poVar22 = (ostream *)std::ostream::operator<<(&std::cout,*local_e0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar22,", node addr: ",0xd);
        poVar22 = std::ostream::_M_insert<void_const*>(poVar22);
        std::__ostream_insert<char,std::char_traits<char>>(poVar22,", node children: ",0x11);
        poVar22 = (ostream *)std::ostream::operator<<(poVar22,pTVar36->node->num_children_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar22,", child index: ",0xf);
        poVar22 = (ostream *)std::ostream::operator<<(poVar22,pTVar36->bucketID);
        std::__ostream_insert<char,std::char_traits<char>>(poVar22,", child repeats in node: ",0x19)
        ;
        poVar22 = (ostream *)
                  std::ostream::operator<<
                            (poVar22,1 << ((pdVar41->super_AlexNode<int,_int>).duplication_factor_ &
                                          0x1f));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar22,", node repeats in parent: ",0x1a);
        poVar22 = (ostream *)
                  std::ostream::operator<<
                            (poVar22,1 << ((pTVar36->node->super_AlexNode<int,_int>).
                                           duplication_factor_ & 0x1f));
        std::__ostream_insert<char,std::char_traits<char>>(poVar22,", new nodes addr: ",0x12);
        poVar22 = std::ostream::_M_insert<void_const*>(poVar22);
        std::__ostream_insert<char,std::char_traits<char>>(poVar22,",",1);
        poVar22 = std::ostream::_M_insert<void_const*>(poVar22);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar22 + -0x18) + (char)poVar22);
        std::ostream::put((char)poVar22);
        std::ostream::flush();
      }
      local_c8 = pAVar42;
      if (to_delete.
          super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          to_delete.
          super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>>::
        _M_realloc_insert<alex::AlexNode<int,int>*>
                  ((vector<alex::AlexNode<int,int>*,std::allocator<alex::AlexNode<int,int>*>> *)
                   &to_delete,
                   (iterator)
                   to_delete.
                   super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(AlexNode<int,_int> **)&local_c8);
      }
      else {
        *to_delete.
         super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = &pAVar42->super_AlexNode<int,_int>;
        to_delete.
        super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             to_delete.
             super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      if ((char)local_b8 == '\0' && !bVar14) {
        piVar1 = &(local_c0->stats_).num_model_nodes;
        *piVar1 = *piVar1 + 1;
      }
      (local_f8->super_AlexNode<int,_int>).duplication_factor_ =
           (pAVar42->super_AlexNode<int,_int>).duplication_factor_;
      (pdVar37->super_AlexNode<int,_int>).duplication_factor_ =
           (pAVar42->super_AlexNode<int,_int>).duplication_factor_;
      uVar33 = uVar23 - 1;
      pTVar30 = (local_b0->
                super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pTVar36 = pTVar30 + uVar33;
      pAVar42 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                 *)pTVar30[uVar33].node;
      iVar40 = (int)(pAVar42->super_AlexNode<int,_int>).level_;
      uVar38 = uVar23 & 0xffffffff;
      pdVar41 = local_f8;
      local_e8 = pdVar37;
    } while (stop_propagation_level < iVar40);
    iVar31 = (int)uVar23;
  }
  if (iVar40 == stop_propagation_level) {
    if (iVar31 == (int)((ulong)((long)(local_b0->
                                      super__Vector_base<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar30)
                       >> 4)) {
      *new_parent = (model_node_type *)pAVar42;
    }
    iVar40 = pTVar36->bucketID;
    bVar17 = (local_f8->super_AlexNode<int,_int>).duplication_factor_;
    iVar31 = 1 << (bVar17 & 0x1f);
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"[Splitting upwards top node] level ",0x23);
      poVar22 = (ostream *)std::ostream::operator<<(&std::cout,stop_propagation_level);
      std::__ostream_insert<char,std::char_traits<char>>(poVar22,", node addr: ",0xd);
      poVar22 = std::ostream::_M_insert<void_const*>(poVar22);
      std::__ostream_insert<char,std::char_traits<char>>(poVar22,", node children: ",0x11);
      poVar22 = (ostream *)std::ostream::operator<<(poVar22,*(int *)&pAVar42->allocator_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar22,", child index: ",0xf);
      poVar22 = (ostream *)std::ostream::operator<<(poVar22,iVar40);
      std::__ostream_insert<char,std::char_traits<char>>(poVar22,", child repeats in node: ",0x19);
      poVar22 = (ostream *)std::ostream::operator<<(poVar22,iVar31);
      std::__ostream_insert<char,std::char_traits<char>>(poVar22,", node repeats in parent: ",0x1a);
      plVar27 = (long *)std::ostream::operator<<
                                  (poVar22,1 << ((pAVar42->super_AlexNode<int,_int>).
                                                 duplication_factor_ & 0x1f));
      std::ios::widen((char)*(undefined8 *)(*plVar27 + -0x18) + (char)plVar27);
      std::ostream::put((char)plVar27);
      std::ostream::flush();
    }
    if (bVar17 == 0) {
      piVar1 = &(local_c0->stats_).num_model_node_expansions;
      *piVar1 = *piVar1 + 1;
      plVar2 = &(local_c0->stats_).num_model_node_expansion_pointers;
      *plVar2 = *plVar2 + (long)*(int *)&pAVar42->allocator_;
      AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>::expand
                ((AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *)pAVar42,1);
      iVar40 = iVar40 * 2;
      iVar31 = 2;
    }
    else {
      puVar3 = &(local_f8->super_AlexNode<int,_int>).duplication_factor_;
      *puVar3 = *puVar3 + 0xff;
      puVar3 = &(local_e8->super_AlexNode<int,_int>).duplication_factor_;
      *puVar3 = *puVar3 + 0xff;
    }
    ppAVar16 = to_delete.
               super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    pAVar15 = local_c0;
    uVar53 = auVar52._8_8_;
    iVar40 = iVar40 - iVar40 % iVar31;
    iVar19 = iVar31 / 2 + iVar40;
    if (1 < iVar31) {
      lVar29 = (long)iVar40;
      do {
        (&(pAVar42->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[lVar29] =
             (_func_int **)local_f8;
        lVar29 = lVar29 + 1;
      } while (lVar29 < iVar19);
    }
    ppAVar13 = to_delete.
               super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if (0 < iVar31) {
      lVar29 = (long)iVar19;
      do {
        (&(pAVar42->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[lVar29] =
             (_func_int **)local_e8;
        lVar29 = lVar29 + 1;
      } while (lVar29 < iVar40 + iVar31);
    }
    for (; ppAVar13 != ppAVar16; ppAVar13 = ppAVar13 + 1) {
      delete_node(pAVar15,*ppAVar13);
      uVar53 = auVar52._8_8_;
    }
    if (to_delete.
        super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(to_delete.
                      super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)to_delete.
                            super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)to_delete.
                            super__Vector_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    auVar46._0_8_ = (double)key;
    auVar46._8_8_ = uVar53;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = dVar58;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar43;
    auVar57 = vfmadd132sd_fma(auVar46,auVar49,auVar6);
    if (auVar57._0_8_ < dVar10) {
      pdVar21 = pdVar20;
    }
    return pdVar21;
  }
  __assert_fail("top_node->level_ == stop_propagation_level",
                "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                ,0x846,
                "data_node_type *alex::Alex<int, int>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
               );
}

Assistant:

data_node_type* split_upwards(
      T key, int stop_propagation_level,
      const std::vector<TraversalNode>& traversal_path, bool reuse_model,
      model_node_type** new_parent, bool verbose = false) {
    assert(stop_propagation_level >= root_node_->level_);
    std::vector<AlexNode<T, P>*> to_delete;  // nodes that need to be deleted

    // Split the data node into two new data nodes
    const TraversalNode& parent_path_node = traversal_path.back();
    model_node_type* parent = parent_path_node.node;
    auto leaf = static_cast<data_node_type*>(
        parent->children_[parent_path_node.bucketID]);
    int leaf_repeats = 1 << (leaf->duplication_factor_);
    int leaf_start_bucketID =
        parent_path_node.bucketID - (parent_path_node.bucketID % leaf_repeats);
    double leaf_mid_bucketID = leaf_start_bucketID + leaf_repeats / 2.0;
    int leaf_end_bucketID =
        leaf_start_bucketID + leaf_repeats;  // first bucket with next child
    stats_.num_sideways_splits++;
    stats_.num_sideways_split_keys += leaf->num_keys_;

    // Determine if either of the two new data nodes will need to adapt to
    // append-mostly behavior
    bool append_mostly_right = leaf->is_append_mostly_right();
    bool left_half_appending_right = false, right_half_appending_right = false;
    if (append_mostly_right) {
      double appending_right_bucketID =
          parent->model_.predict_double(leaf->max_key_);
      if (appending_right_bucketID >= leaf_start_bucketID &&
          appending_right_bucketID < leaf_mid_bucketID) {
        left_half_appending_right = true;
      } else if (appending_right_bucketID >= leaf_mid_bucketID &&
                 appending_right_bucketID < leaf_end_bucketID) {
        right_half_appending_right = true;
      }
    }
    bool append_mostly_left = leaf->is_append_mostly_left();
    bool left_half_appending_left = false, right_half_appending_left = false;
    if (append_mostly_left) {
      double appending_left_bucketID =
          parent->model_.predict_double(leaf->min_key_);
      if (appending_left_bucketID >= leaf_start_bucketID &&
          appending_left_bucketID < leaf_mid_bucketID) {
        left_half_appending_left = true;
      } else if (appending_left_bucketID >= leaf_mid_bucketID &&
                 appending_left_bucketID < leaf_end_bucketID) {
        right_half_appending_left = true;
      }
    }

    int mid_boundary = leaf->lower_bound(
        (leaf_mid_bucketID - parent->model_.b_) / parent->model_.a_);
    data_node_type* left_leaf = bulk_load_leaf_node_from_existing(
        leaf, 0, mid_boundary, true, nullptr, reuse_model,
        append_mostly_right && left_half_appending_right,
        append_mostly_left && left_half_appending_left);
    data_node_type* right_leaf = bulk_load_leaf_node_from_existing(
        leaf, mid_boundary, leaf->data_capacity_, true, nullptr, reuse_model,
        append_mostly_right && right_half_appending_right,
        append_mostly_left && right_half_appending_left);
    // This is the expected duplication factor; it will be correct once we
    // split/expand the parent
    left_leaf->duplication_factor_ = leaf->duplication_factor_;
    right_leaf->duplication_factor_ = leaf->duplication_factor_;
    left_leaf->level_ = leaf->level_;
    right_leaf->level_ = leaf->level_;
    link_data_nodes(leaf, left_leaf, right_leaf);
    to_delete.push_back(leaf);
    stats_.num_data_nodes--;

    if (verbose) {
      std::cout << "[Splitting upwards data node] level " << leaf->level_
                << ", node addr: " << leaf
                << ", node repeats in parent: " << leaf_repeats
                << ", node indexes in parent: [" << leaf_start_bucketID << ", "
                << leaf_end_bucketID << ")"
                << ", left leaf indexes: [0, " << mid_boundary << ")"
                << ", right leaf indexes: [" << mid_boundary << ", "
                << leaf->data_capacity_ << ")"
                << ", new nodes addr: " << left_leaf << "," << right_leaf
                << std::endl;
    }

    // The new data node that the key falls into is the one we return
    data_node_type* new_data_node;
    if (parent->model_.predict_double(key) < leaf_mid_bucketID) {
      new_data_node = left_leaf;
    } else {
      new_data_node = right_leaf;
    }

    // Split all internal nodes from the parent up to the highest node along the
    // traversal path.
    // As this happens, the entries of the traversal path will go stale, which
    // is fine because we no longer use them.
    // Splitting an internal node involves dividing the child pointers into two
    // halves, and doubling the relevant half.
    AlexNode<T, P>* prev_left_split = left_leaf;
    AlexNode<T, P>* prev_right_split = right_leaf;
    int path_idx = static_cast<int>(traversal_path.size()) - 1;
    while (traversal_path[path_idx].node->level_ > stop_propagation_level) {
      // Decide which half to double
      const TraversalNode& path_node = traversal_path[path_idx];
      model_node_type* cur_node = path_node.node;
      stats_.num_model_node_splits++;
      stats_.num_model_node_split_pointers += cur_node->num_children_;
      bool double_left_half = path_node.bucketID < cur_node->num_children_ / 2;
      model_node_type* left_split = nullptr;
      model_node_type* right_split = nullptr;

      // If one of the resulting halves will only have one child pointer, we
      // should "pull up" that child
      bool pull_up_left_child = false, pull_up_right_child = false;
      AlexNode<T, P>* left_half_first_child = cur_node->children_[0];
      AlexNode<T, P>* right_half_first_child =
          cur_node->children_[cur_node->num_children_ / 2];
      if (double_left_half &&
          (1 << right_half_first_child->duplication_factor_) ==
              cur_node->num_children_ / 2) {
        // pull up right child if all children in the right half are the same
        pull_up_right_child = true;
        left_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
      } else if (!double_left_half &&
                 (1 << left_half_first_child->duplication_factor_) ==
                     cur_node->num_children_ / 2) {
        // pull up left child if all children in the left half are the same
        pull_up_left_child = true;
        right_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
      } else {
        left_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
        right_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
      }

      // Do the split
      AlexNode<T, P>* next_left_split = nullptr;
      AlexNode<T, P>* next_right_split = nullptr;
      if (double_left_half) {
        // double left half
        assert(left_split != nullptr);
        if (path_idx == static_cast<int>(traversal_path.size()) - 1) {
          *new_parent = left_split;
        }
        left_split->num_children_ = cur_node->num_children_;
        left_split->children_ =
            new (pointer_allocator().allocate(left_split->num_children_))
                AlexNode<T, P>*[left_split->num_children_];
        left_split->model_.a_ = cur_node->model_.a_ * 2;
        left_split->model_.b_ = cur_node->model_.b_ * 2;
        int cur = 0;
        while (cur < cur_node->num_children_ / 2) {
          AlexNode<T, P>* cur_child = cur_node->children_[cur];
          int cur_child_repeats = 1 << cur_child->duplication_factor_;
          for (int i = 2 * cur; i < 2 * (cur + cur_child_repeats); i++) {
            left_split->children_[i] = cur_child;
          }
          cur_child->duplication_factor_++;
          cur += cur_child_repeats;
        }
        assert(cur == cur_node->num_children_ / 2);

        if (pull_up_right_child) {
          next_right_split = cur_node->children_[cur_node->num_children_ / 2];
          next_right_split->level_ = cur_node->level_;
        } else {
          right_split->num_children_ = cur_node->num_children_ / 2;
          right_split->children_ =
              new (pointer_allocator().allocate(right_split->num_children_))
                  AlexNode<T, P>*[right_split->num_children_];
          right_split->model_.a_ = cur_node->model_.a_;
          right_split->model_.b_ =
              cur_node->model_.b_ - cur_node->num_children_ / 2;
          int j = 0;
          for (int i = cur_node->num_children_ / 2; i < cur_node->num_children_;
               i++) {
            right_split->children_[j] = cur_node->children_[i];
            j++;
          }
          next_right_split = right_split;
        }

        int new_bucketID = path_node.bucketID * 2;
        int repeats = 1 << (prev_left_split->duplication_factor_ + 1);
        int start_bucketID =
            new_bucketID -
            (new_bucketID % repeats);  // first bucket with same child
        int mid_bucketID = start_bucketID + repeats / 2;
        int end_bucketID =
            start_bucketID + repeats;  // first bucket with next child
        for (int i = start_bucketID; i < mid_bucketID; i++) {
          left_split->children_[i] = prev_left_split;
        }
        for (int i = mid_bucketID; i < end_bucketID; i++) {
          left_split->children_[i] = prev_right_split;
        }
        next_left_split = left_split;
      } else {
        // double right half
        assert(right_split != nullptr);
        if (path_idx == static_cast<int>(traversal_path.size()) - 1) {
          *new_parent = right_split;
        }
        if (pull_up_left_child) {
          next_left_split = cur_node->children_[0];
          next_left_split->level_ = cur_node->level_;
        } else {
          left_split->num_children_ = cur_node->num_children_ / 2;
          left_split->children_ =
              new (pointer_allocator().allocate(left_split->num_children_))
                  AlexNode<T, P>*[left_split->num_children_];
          left_split->model_.a_ = cur_node->model_.a_;
          left_split->model_.b_ = cur_node->model_.b_;
          int j = 0;
          for (int i = 0; i < cur_node->num_children_ / 2; i++) {
            left_split->children_[j] = cur_node->children_[i];
            j++;
          }
          next_left_split = left_split;
        }

        right_split->num_children_ = cur_node->num_children_;
        right_split->children_ =
            new (pointer_allocator().allocate(right_split->num_children_))
                AlexNode<T, P>*[right_split->num_children_];
        right_split->model_.a_ = cur_node->model_.a_ * 2;
        right_split->model_.b_ =
            (cur_node->model_.b_ - cur_node->num_children_ / 2) * 2;
        int cur = cur_node->num_children_ / 2;
        while (cur < cur_node->num_children_) {
          AlexNode<T, P>* cur_child = cur_node->children_[cur];
          int cur_child_repeats = 1 << cur_child->duplication_factor_;
          int right_child_idx = cur - cur_node->num_children_ / 2;
          for (int i = 2 * right_child_idx;
               i < 2 * (right_child_idx + cur_child_repeats); i++) {
            right_split->children_[i] = cur_child;
          }
          cur_child->duplication_factor_++;
          cur += cur_child_repeats;
        }
        assert(cur == cur_node->num_children_);

        int new_bucketID =
            (path_node.bucketID - cur_node->num_children_ / 2) * 2;
        int repeats = 1 << (prev_left_split->duplication_factor_ + 1);
        int start_bucketID =
            new_bucketID -
            (new_bucketID % repeats);  // first bucket with same child
        int mid_bucketID = start_bucketID + repeats / 2;
        int end_bucketID =
            start_bucketID + repeats;  // first bucket with next child
        for (int i = start_bucketID; i < mid_bucketID; i++) {
          right_split->children_[i] = prev_left_split;
        }
        for (int i = mid_bucketID; i < end_bucketID; i++) {
          right_split->children_[i] = prev_right_split;
        }
        next_right_split = right_split;
      }
      assert(next_left_split != nullptr && next_right_split != nullptr);
      if (verbose) {
        std::cout << "[Splitting upwards through-node] level "
                  << cur_node->level_ << ", node addr: " << path_node.node
                  << ", node children: " << path_node.node->num_children_
                  << ", child index: " << path_node.bucketID
                  << ", child repeats in node: "
                  << (1 << prev_left_split->duplication_factor_)
                  << ", node repeats in parent: "
                  << (1 << path_node.node->duplication_factor_)
                  << ", new nodes addr: " << left_split << "," << right_split
                  << std::endl;
      }
      to_delete.push_back(cur_node);
      if (!pull_up_left_child && !pull_up_right_child) {
        stats_.num_model_nodes++;
      }
      // This is the expected duplication factor; it will be correct once we
      // split/expand the parent
      next_left_split->duplication_factor_ = cur_node->duplication_factor_;
      next_right_split->duplication_factor_ = cur_node->duplication_factor_;
      prev_left_split = next_left_split;
      prev_right_split = next_right_split;
      path_idx--;
    }

    // Insert into the top node
    const TraversalNode& top_path_node = traversal_path[path_idx];
    model_node_type* top_node = top_path_node.node;
    assert(top_node->level_ == stop_propagation_level);
    if (path_idx == static_cast<int>(traversal_path.size()) - 1) {
      *new_parent = top_node;
    }
    int top_bucketID = top_path_node.bucketID;
    int repeats =
        1 << prev_left_split->duplication_factor_;  // this was the duplication
                                                    // factor of the child that
                                                    // was deleted
    if (verbose) {
      std::cout << "[Splitting upwards top node] level "
                << stop_propagation_level << ", node addr: " << top_node
                << ", node children: " << top_node->num_children_
                << ", child index: " << top_bucketID
                << ", child repeats in node: " << repeats
                << ", node repeats in parent: "
                << (1 << top_node->duplication_factor_) << std::endl;
    }

    // Expand the top node if necessary
    if (repeats == 1) {
      stats_.num_model_node_expansions++;
      stats_.num_model_node_expansion_pointers += top_node->num_children_;
      top_node->expand(1);  // double size of top node
      top_bucketID *= 2;
      repeats *= 2;
    } else {
      prev_left_split->duplication_factor_--;
      prev_right_split->duplication_factor_--;
    }

    int start_bucketID =
        top_bucketID -
        (top_bucketID % repeats);  // first bucket with same child
    int mid_bucketID = start_bucketID + repeats / 2;
    int end_bucketID =
        start_bucketID + repeats;  // first bucket with next child
    for (int i = start_bucketID; i < mid_bucketID; i++) {
      top_node->children_[i] = prev_left_split;
    }
    for (int i = mid_bucketID; i < end_bucketID; i++) {
      top_node->children_[i] = prev_right_split;
    }

    for (auto node : to_delete) {
      delete_node(node);
    }

    return new_data_node;
  }